

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O1

int __thiscall iqnet::Socket::listen(Socket *this,int __fd,int __n)

{
  network_error *this_00;
  int iVar1;
  string local_40;
  
  iVar1 = ::listen(this->sock,__fd);
  if (iVar1 != -1) {
    return iVar1;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Socket::listen","");
  network_error::network_error(this_00,&local_40,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::listen( unsigned blog )
{
  if( ::listen( sock, blog ) == -1 )
    throw network_error( "Socket::listen" );
}